

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MidiEvent.cpp
# Opt level: O0

MidiEvent * __thiscall smf::MidiEvent::operator=(MidiEvent *this,MidiEvent *mfevent)

{
  value_type vVar1;
  size_type sVar2;
  const_reference pvVar3;
  reference pvVar4;
  int local_24;
  int i;
  MidiEvent *mfevent_local;
  MidiEvent *this_local;
  
  if (this != mfevent) {
    this->tick = mfevent->tick;
    this->track = mfevent->track;
    this->seconds = mfevent->seconds;
    this->seq = mfevent->seq;
    this->m_eventlink = (MidiEvent *)0x0;
    sVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)mfevent);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)this,sVar2);
    for (local_24 = 0;
        sVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                          ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)this),
        local_24 < (int)sVar2; local_24 = local_24 + 1) {
      pvVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                         ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)mfevent,
                          (long)local_24);
      vVar1 = *pvVar3;
      pvVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                         ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)this,
                          (long)local_24);
      *pvVar4 = vVar1;
    }
  }
  return this;
}

Assistant:

MidiEvent& MidiEvent::operator=(const MidiEvent& mfevent) {
	if (this == &mfevent) {
		return *this;
	}
	tick    = mfevent.tick;
	track   = mfevent.track;
	seconds = mfevent.seconds;
	seq     = mfevent.seq;
	m_eventlink = NULL;
	this->resize(mfevent.size());
	for (int i=0; i<(int)this->size(); i++) {
		(*this)[i] = mfevent[i];
	}
	return *this;
}